

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

FunctionData * __thiscall
inja::FunctionStorage::get_or_new(FunctionStorage *this,string_view name,uint num_args)

{
  FunctionData *i;
  mapped_type *this_00;
  pointer pFVar1;
  mapped_type *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  const_pointer local_28;
  size_type local_20;
  
  local_20 = name.size_;
  local_28 = name.data_;
  nonstd::sv_lite::basic_string_view::operator_cast_to_string
            (&bStack_48,(basic_string_view *)&local_28);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
            ::operator[](&this->m_map,&bStack_48);
  std::__cxx11::string::~string((string *)&bStack_48);
  pFVar1 = (this_00->
           super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pFVar1 == (this_00->
                  super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
      ::emplace_back<>(this_00);
      pFVar1 = (this_00->
               super__Vector_base<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pFVar1[-1].num_args = num_args;
      return pFVar1 + -1;
    }
    if (pFVar1->num_args == num_args) break;
    pFVar1 = pFVar1 + 1;
  }
  return pFVar1;
}

Assistant:

FunctionData& get_or_new(nonstd::string_view name, unsigned int num_args) {
		auto& vec = m_map[static_cast<std::string>(name)];
		for (auto& i : vec) {
			if (i.num_args == num_args) return i;
		}
		vec.emplace_back();
		vec.back().num_args = num_args;
		return vec.back();
	}